

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QTimeZonePrivate::Data>::reallocateAndGrow
          (QArrayDataPointer<QTimeZonePrivate::Data> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTimeZonePrivate::Data> *old)

{
  long lVar1;
  bool bVar2;
  Data *pDVar3;
  QGenericArrayOps<QTimeZonePrivate::Data> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QTimeZonePrivate::Data> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QTimeZonePrivate::Data> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  Data *in_stack_ffffffffffffff70;
  Data *in_stack_ffffffffffffff78;
  QGenericArrayOps<QTimeZonePrivate::Data> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QTimeZonePrivate::Data> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff70),
      bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QTimeZonePrivate::Data> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,
                 in_ESI);
    if ((0 < in_RDX) &&
       (pDVar3 = data((QArrayDataPointer<QTimeZonePrivate::Data> *)&stack0xffffffffffffffe0),
       pDVar3 == (Data *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00744cc2;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QTimeZonePrivate::Data> *)
                  operator->((QArrayDataPointer<QTimeZonePrivate::Data> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QTimeZonePrivate::Data> *)0x744bc7);
        begin((QArrayDataPointer<QTimeZonePrivate::Data> *)0x744bd6);
        QtPrivate::QGenericArrayOps<QTimeZonePrivate::Data>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (Data *)operator->((QArrayDataPointer<QTimeZonePrivate::Data> *)
                                &stack0xffffffffffffffe0);
        pDVar3 = begin((QArrayDataPointer<QTimeZonePrivate::Data> *)0x744c15);
        begin((QArrayDataPointer<QTimeZonePrivate::Data> *)0x744c24);
        QtPrivate::QGenericArrayOps<QTimeZonePrivate::Data>::moveAppend
                  (in_stack_ffffffffffffff80,pDVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QTimeZonePrivate::Data> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QTimeZonePrivate::Data> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QTimeZonePrivate::Data>::reallocate
              ((QMovableArrayOps<QTimeZonePrivate::Data> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00744cc2:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }